

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::subpass_description2_is_supported
          (Impl *this,VkSubpassDescription2 *sub)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  bVar2 = subpass_description_flags_is_supported(this,sub->flags);
  if ((bVar2) && (bVar2 = pnext_chain_is_supported(this,sub->pNext), bVar2)) {
    if (sub->colorAttachmentCount != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        bVar2 = attachment_reference2_is_supported
                          (this,(VkAttachmentReference2 *)
                                ((long)&sub->pColorAttachments->sType + lVar5));
        if (!bVar2) {
          return false;
        }
        if ((sub->pResolveAttachments != (VkAttachmentReference2 *)0x0) &&
           (bVar2 = attachment_reference2_is_supported
                              (this,(VkAttachmentReference2 *)
                                    ((long)&sub->pResolveAttachments->sType + lVar5)), !bVar2)) {
          return false;
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x20;
      } while (uVar4 < sub->colorAttachmentCount);
    }
    if (sub->inputAttachmentCount != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        bVar2 = attachment_reference2_is_supported
                          (this,(VkAttachmentReference2 *)
                                ((long)&sub->pInputAttachments->sType + lVar5));
        if (!bVar2) {
          return false;
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x20;
      } while (uVar4 < sub->inputAttachmentCount);
    }
    if ((sub->pDepthStencilAttachment == (VkAttachmentReference2 *)0x0) ||
       (bVar2 = attachment_reference2_is_supported(this,sub->pDepthStencilAttachment), bVar2)) {
      if (sub->viewMask != 0) {
        uVar1 = (this->props).multiview.maxMultiviewViewCount;
        uVar3 = -1 << ((byte)uVar1 & 0x1f);
        if (0x1f < uVar1) {
          uVar3 = 0;
        }
        if ((uVar3 & sub->viewMask) != 0) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::subpass_description2_is_supported(const VkSubpassDescription2 &sub) const
{
	if (!subpass_description_flags_is_supported(sub.flags))
		return false;

	if (!pnext_chain_is_supported(sub.pNext))
		return false;

	for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
	{
		if (!attachment_reference2_is_supported(sub.pColorAttachments[j]))
			return false;
		if (sub.pResolveAttachments && !attachment_reference2_is_supported(sub.pResolveAttachments[j]))
			return false;
	}

	for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
		if (!attachment_reference2_is_supported(sub.pInputAttachments[j]))
			return false;

	if (sub.pDepthStencilAttachment && !attachment_reference2_is_supported(*sub.pDepthStencilAttachment))
		return false;

	if (sub.viewMask && !multiview_mask_is_supported(sub.viewMask))
		return false;

	return true;
}